

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::updateThresholdLbChange
          (HighsDomain *this,HighsInt col,double newbound,double val,double *threshold)

{
  initializer_list<double> __l;
  reference pvVar1;
  double *in_RDX;
  int in_ESI;
  long in_RDI;
  HighsDomain *in_XMM0_Qa;
  double dVar2;
  double thresholdNew;
  undefined4 uVar3;
  HighsInt col_00;
  HighsVarType var_type;
  HighsDomain *tolerance;
  double in_stack_ffffffffffffffa8;
  double in_stack_ffffffffffffffb0;
  
  tolerance = in_XMM0_Qa;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 800),(long)in_ESI);
  if (((double)tolerance != *pvVar1) || (NAN((double)tolerance) || NAN(*pvVar1))) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 800),(long)in_ESI);
    var_type = (HighsVarType)((ulong)in_RDI >> 0x38);
    uVar3 = SUB84(*pvVar1,0);
    col_00 = (HighsInt)((ulong)*pvVar1 >> 0x20);
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x5c307e)
    ;
    variableType(in_XMM0_Qa,col_00);
    boundRange(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(double)tolerance,var_type);
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x5c30f9)
    ;
    __l._M_array._4_4_ = col_00;
    __l._M_array._0_4_ = uVar3;
    __l._M_len = (size_type)in_XMM0_Qa;
    dVar2 = std::max<double>(__l);
    *in_RDX = dVar2;
  }
  return;
}

Assistant:

void HighsDomain::updateThresholdLbChange(HighsInt col, double newbound,
                                          double val, double& threshold) {
  if (newbound != col_upper_[col]) {
    double thresholdNew =
        std::fabs(val) * boundRange(col_upper_[col], newbound,
                                    mipsolver->mipdata_->feastol,
                                    variableType(col));

    // the new threshold is now the maximum of the new threshold and the current
    // one
    threshold =
        std::max({threshold, thresholdNew, mipsolver->mipdata_->feastol});
  }
}